

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O3

void __thiscall SM83::jp_a16<(SM83::Conditions)3>(SM83 *this)

{
  u16 uVar1;
  string_view fmt;
  format_args args;
  ulong local_98 [2];
  ulong local_88;
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  char *local_38;
  undefined8 local_30;
  ulong local_28;
  
  uVar1 = GetWordFromPC(this);
  local_98[0] = (ulong)(this->field_0).af;
  local_88 = (ulong)(this->field_1).bc;
  local_78 = (ulong)(this->field_2).de;
  local_68 = (ulong)(this->field_3).hl;
  local_58 = (ulong)this->sp;
  local_48 = (ulong)this->pc_at_opcode;
  local_38 = "Z";
  local_30 = 1;
  local_28 = (ulong)uVar1;
  fmt.size_ = 0x4d;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  JP {}, 0x{:04X}\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_98;
  args.desc_ = 0x2d222222;
  ::fmt::v11::vprint(fmt,args);
  if ((char)(this->field_0).field_1.f < '\0') {
    this->pc = uVar1;
    Timer::AdvanceCycles(this->timer,4);
  }
  return;
}

Assistant:

void SM83::jp_a16() {
    const u16 addr = GetWordFromPC();

    if constexpr (cond == Conditions::None) {
        LTRACE("JP 0x{:04X}", addr);
    } else {
        LTRACE("JP {}, 0x{:04X}", GetConditionString<cond>(), addr);
    }

    if (MeetsCondition<cond>()) {
        pc = addr;
        timer.AdvanceCycles(4);
    }
}